

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O1

Abc_Obj_t * Abc_NtkFetchTwinNode(Abc_Obj_t *pNode)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pAVar3;
  uint uVar4;
  Mio_Gate_t *pMVar5;
  Mio_Gate_t *pMVar6;
  
  if (pNode->pNtk->ntkFunc != ABC_FUNC_MAP) {
    __assert_fail("Abc_NtkHasMapping(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                  ,0x31b,"Abc_Obj_t *Abc_NtkFetchTwinNode(Abc_Obj_t *)");
  }
  pMVar6 = (Mio_Gate_t *)(pNode->field_5).pData;
  if ((pMVar6 != (Mio_Gate_t *)0x0) &&
     (pMVar5 = Mio_GateReadTwin(pMVar6), pMVar5 != (Mio_Gate_t *)0x0)) {
    pVVar2 = pNode->pNtk->vObjs;
    iVar1 = pVVar2->nSize;
    if (pNode->Id != iVar1 + -1) {
      uVar4 = pNode->Id + 1;
      if (((int)uVar4 < 0) || (iVar1 <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar3 = (Abc_Obj_t *)pVVar2->pArray[uVar4];
      if (((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) &&
         ((pNode->vFanins).nSize == (pAVar3->vFanins).nSize)) {
        pMVar6 = Mio_GateReadTwin(pMVar6);
        if (pMVar6 != (Mio_Gate_t *)(pAVar3->field_5).pData) {
          return (Abc_Obj_t *)0x0;
        }
        return pAVar3;
      }
    }
  }
  return (Abc_Obj_t *)0x0;
}

Assistant:

Abc_Obj_t * Abc_NtkFetchTwinNode( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNode2;
    Mio_Gate_t * pGate = (Mio_Gate_t *)pNode->pData;
    assert( Abc_NtkHasMapping(pNode->pNtk) );
    if ( pGate == NULL || Mio_GateReadTwin(pGate) == NULL )
        return NULL;
    // assuming the twin node is following next
    if ( (int)Abc_ObjId(pNode) == Abc_NtkObjNumMax(pNode->pNtk) - 1 )
        return NULL;
    pNode2 = Abc_NtkObj( pNode->pNtk, Abc_ObjId(pNode) + 1 );
    if ( pNode2 == NULL || !Abc_ObjIsNode(pNode2) || Abc_ObjFaninNum(pNode) != Abc_ObjFaninNum(pNode2) )
        return NULL;
    if ( Mio_GateReadTwin(pGate) != (Mio_Gate_t *)pNode2->pData )
        return NULL;
    return pNode2;
}